

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conjunction_simplification.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::ConjunctionSimplificationRule::Apply
          (ConjunctionSimplificationRule *this,LogicalOperator *op,
          vector<std::reference_wrapper<duckdb::Expression>,_true> *bindings,bool *changes_made,
          bool is_root)

{
  Expression *expr;
  bool bVar1;
  reference pvVar2;
  BoundConjunctionExpression *expr_00;
  ClientContext *context;
  BoundConstantExpression *this_00;
  BoundConjunctionExpression *conj;
  Value constant_value;
  Value local_100;
  LogicalType local_c0;
  Value local_a8;
  
  pvVar2 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,0);
  expr_00 = BaseExpression::Cast<duckdb::BoundConjunctionExpression>
                      (&pvVar2->_M_data->super_BaseExpression);
  pvVar2 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,1);
  expr = pvVar2->_M_data;
  LogicalType::LogicalType(&local_c0,SQLNULL);
  Value::Value(&local_a8,&local_c0);
  LogicalType::~LogicalType(&local_c0);
  context = Rule::GetContext((Rule *)op);
  bVar1 = ExpressionExecutor::TryEvaluateScalar(context,expr,&local_a8);
  if (bVar1) {
    LogicalType::LogicalType(&local_100.type_,BOOLEAN);
    Value::DefaultCastAs((Value *)&stack0xffffffffffffff98,&local_a8,&local_100.type_,false);
    conj = (BoundConjunctionExpression *)&stack0xffffffffffffff98;
    Value::operator=(&local_a8,(Value *)&stack0xffffffffffffff98);
    Value::~Value((Value *)&stack0xffffffffffffff98);
    LogicalType::~LogicalType(&local_100.type_);
    if (local_a8.is_null != true) {
      if ((expr_00->super_Expression).super_BaseExpression.type == CONJUNCTION_AND) {
        bVar1 = BooleanValue::Get(&local_a8);
        if (bVar1) {
LAB_00682b43:
          RemoveExpression(this,conj,&expr_00->super_Expression);
          goto LAB_00682a68;
        }
        Value::BOOLEAN(&local_100,false);
        this_00 = (BoundConstantExpression *)operator_new(0x98);
        Value::Value((Value *)&stack0xffffffffffffff98,&local_100);
        BoundConstantExpression::BoundConstantExpression(this_00,(Value *)&stack0xffffffffffffff98);
      }
      else {
        bVar1 = BooleanValue::Get(&local_a8);
        if (!bVar1) goto LAB_00682b43;
        Value::BOOLEAN(&local_100,true);
        this_00 = (BoundConstantExpression *)operator_new(0x98);
        Value::Value((Value *)&stack0xffffffffffffff98,&local_100);
        BoundConstantExpression::BoundConstantExpression(this_00,(Value *)&stack0xffffffffffffff98);
      }
      Value::~Value((Value *)&stack0xffffffffffffff98);
      (this->super_Rule)._vptr_Rule = (_func_int **)this_00;
      Value::~Value(&local_100);
      goto LAB_00682a68;
    }
  }
  (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
LAB_00682a68:
  Value::~Value(&local_a8);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> ConjunctionSimplificationRule::Apply(LogicalOperator &op,
                                                            vector<reference<Expression>> &bindings, bool &changes_made,
                                                            bool is_root) {
	auto &conjunction = bindings[0].get().Cast<BoundConjunctionExpression>();
	auto &constant_expr = bindings[1].get();
	// the constant_expr is a scalar expression that we have to fold
	// use an ExpressionExecutor to execute the expression
	D_ASSERT(constant_expr.IsFoldable());
	Value constant_value;
	if (!ExpressionExecutor::TryEvaluateScalar(GetContext(), constant_expr, constant_value)) {
		return nullptr;
	}
	constant_value = constant_value.DefaultCastAs(LogicalType::BOOLEAN);
	if (constant_value.IsNull()) {
		// we can't simplify conjunctions with a constant NULL
		return nullptr;
	}
	if (conjunction.GetExpressionType() == ExpressionType::CONJUNCTION_AND) {
		if (!BooleanValue::Get(constant_value)) {
			// FALSE in AND, result of expression is false
			return make_uniq<BoundConstantExpression>(Value::BOOLEAN(false));
		} else {
			// TRUE in AND, remove the expression from the set
			return RemoveExpression(conjunction, constant_expr);
		}
	} else {
		D_ASSERT(conjunction.GetExpressionType() == ExpressionType::CONJUNCTION_OR);
		if (!BooleanValue::Get(constant_value)) {
			// FALSE in OR, remove the expression from the set
			return RemoveExpression(conjunction, constant_expr);
		} else {
			// TRUE in OR, result of expression is true
			return make_uniq<BoundConstantExpression>(Value::BOOLEAN(true));
		}
	}
}